

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O2

bool bloaty::dwarf::IsValidDwarfAddress(uint64_t addr,uint8_t address_size)

{
  if (addr != 0) {
    if (address_size == '\b') {
      if (addr != 0xffffffffffffffff) {
        return true;
      }
    }
    else if ((address_size != '\x04') || (addr != 0xffffffff)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool IsValidDwarfAddress(uint64_t addr, uint8_t address_size) {
  if (addr == 0)
    return false;
  if (address_size == 4 && addr == std::numeric_limits<uint32_t>::max())
    return false;
  if (address_size == 8 && addr == std::numeric_limits<uint64_t>::max())
    return false;
  return true;
}